

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QLocale::Country>::reallocate
          (QPodArrayOps<QLocale::Country> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QLocale::Country>_*,_QLocale::Country_*> pVar1;
  
  pVar1 = QTypedArrayData<QLocale::Country>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<QLocale::Country>).d,
                     (this->super_QArrayDataPointer<QLocale::Country>).ptr,alloc,option);
  if (pVar1.second != (Country *)0x0) {
    (this->super_QArrayDataPointer<QLocale::Country>).d = pVar1.first;
    (this->super_QArrayDataPointer<QLocale::Country>).ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }